

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxReturnStatement::Resolve(FxReturnStatement *this,FCompileContext *ctx)

{
  FxExpression *x;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FxTypeCast *this_00;
  PType **ppPVar4;
  undefined4 extraout_var_00;
  uint extraout_var_01;
  size_t size;
  undefined1 local_38 [8];
  TArray<PType_*,_PType_*> none;
  PPrototype *retproto;
  FCompileContext *ctx_local;
  FxReturnStatement *this_local;
  
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->Value != (FxExpression *)0x0) {
      if (this->Value != (FxExpression *)0x0) {
        iVar2 = (*this->Value->_vptr_FxExpression[2])();
        this->Value = (FxExpression *)CONCAT44(extraout_var,iVar2);
      }
      if (this->Value == (FxExpression *)0x0) {
        if (this != (FxReturnStatement *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
    }
    if (this->Value == (FxExpression *)0x0) {
      TArray<PType_*,_PType_*>::TArray((TArray<PType_*,_PType_*> *)local_38,0);
      none._8_8_ = NewPrototype((TArray<PType_*,_PType_*> *)local_38,
                                (TArray<PType_*,_PType_*> *)local_38);
      TArray<PType_*,_PType_*>::~TArray((TArray<PType_*,_PType_*> *)local_38);
    }
    else {
      if ((ctx->ReturnProto != (PPrototype *)0x0) &&
         (uVar3 = TArray<PType_*,_PType_*>::Size(&ctx->ReturnProto->ReturnTypes), uVar3 != 0)) {
        size = 0;
        bVar1 = FName::operator!=((FName *)&(ctx->Function->super_PSymbol).super_PTypeBase.
                                            super_DObject.field_0x24,NAME_None);
        if (bVar1) {
          this_00 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,size);
          x = this->Value;
          ppPVar4 = TArray<PType_*,_PType_*>::operator[](&ctx->ReturnProto->ReturnTypes,0);
          FxTypeCast::FxTypeCast(this_00,x,*ppPVar4,false,false);
          this->Value = (FxExpression *)this_00;
          iVar2 = (*this->Value->_vptr_FxExpression[2])(this->Value,ctx);
          this->Value = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
          if (this->Value == (FxExpression *)0x0) {
            if (this != (FxReturnStatement *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
      }
      none.Most = (*this->Value->_vptr_FxExpression[5])();
      none.Count = extraout_var_01;
    }
    FCompileContext::CheckReturn
              (ctx,(PPrototype *)none._8_8_,&(this->super_FxExpression).ScriptPosition);
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxReturnStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Value, ctx);

	PPrototype *retproto;
	if (Value == nullptr)
	{
		TArray<PType *> none(0);
		retproto = NewPrototype(none, none);
	}
	else
	{
		// If we already know the real return type we need at least try to cast the value to its proper type (unless in an anonymous function.)
		if (ctx.ReturnProto != nullptr && ctx.ReturnProto->ReturnTypes.Size() > 0 && ctx.Function->SymbolName != NAME_None)
		{
			Value = new FxTypeCast(Value, ctx.ReturnProto->ReturnTypes[0], false, false);
			Value = Value->Resolve(ctx);
			ABORT(Value);
		}
		retproto = Value->ReturnProto();
	}

	ctx.CheckReturn(retproto, ScriptPosition);

	return this;
}